

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cLayoutBindingTests.cpp
# Opt level: O0

void __thiscall
glcts::LayoutBindingBaseCase::setTemplateParam
          (LayoutBindingBaseCase *this,eStageType stage,char *param,String *value)

{
  String *__s;
  char *pcVar1;
  mapped_type *this_00;
  mapped_type *this_01;
  allocator<char> local_49;
  key_type local_48;
  String *local_28;
  String *value_local;
  char *param_local;
  LayoutBindingBaseCase *pLStack_10;
  eStageType stage_local;
  LayoutBindingBaseCase *this_local;
  
  local_28 = value;
  value_local = (String *)param;
  param_local._4_4_ = stage;
  pLStack_10 = this;
  pcVar1 = (char *)std::__cxx11::string::c_str();
  this_00 = std::
            map<glcts::eStageType,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<glcts::eStageType>,_std::allocator<std::pair<const_glcts::eStageType,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
            ::operator[](&this->m_templateParams,(key_type *)((long)&param_local + 4));
  __s = value_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,(char *)__s,&local_49);
  this_01 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](this_00,&local_48);
  std::__cxx11::string::operator=((string *)this_01,pcVar1);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator(&local_49);
  return;
}

Assistant:

void setTemplateParam(eStageType stage, const char* param, const String& value)
	{
		m_templateParams[stage][param] = value.c_str();
	}